

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,false>
               (string_t *ldata,interval_t *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  interval_t iVar9;
  interval_t date;
  interval_t date_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 8;
      do {
        specifier_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar5);
        specifier_01.value._0_8_ = *(undefined8 *)((long)ldata + lVar5 + -8);
        iVar9.micros = *(int64_t *)((long)&rdata->months + lVar5);
        iVar9._0_8_ = *(undefined8 *)((long)rdata + lVar5 + -8);
        iVar9 = DateTruncBinaryOperator::
                Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                          (specifier_01,iVar9);
        *(long *)((long)result_data + lVar5 + -8) = iVar9._0_8_;
        *(int64_t *)((long)&result_data->months + lVar5) = iVar9.micros;
        lVar5 = lVar5 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar2 = 0;
    uVar8 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar3 = 0xffffffffffffffff;
      }
      else {
        uVar3 = puVar1[uVar2];
      }
      uVar6 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar6 = count;
      }
      uVar4 = uVar6;
      if (uVar3 != 0) {
        uVar4 = uVar8;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar8 < uVar6) {
            uVar3 = uVar8 << 4 | 8;
            do {
              specifier.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar3);
              specifier.value._0_8_ = *(undefined8 *)((long)ldata + (uVar3 - 8));
              date.micros = *(int64_t *)((long)&rdata->months + uVar3);
              date._0_8_ = *(undefined8 *)((long)rdata + (uVar3 - 8));
              iVar9 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                                (specifier,date);
              *(long *)((long)result_data + (uVar3 - 8)) = iVar9._0_8_;
              *(int64_t *)((long)&result_data->months + uVar3) = iVar9.micros;
              uVar8 = uVar8 + 1;
              uVar3 = uVar3 + 0x10;
              uVar4 = uVar8;
            } while (uVar6 != uVar8);
          }
        }
        else if (uVar8 < uVar6) {
          uVar7 = uVar8 << 4 | 8;
          uVar4 = 0;
          do {
            if ((uVar3 >> (uVar4 & 0x3f) & 1) != 0) {
              specifier_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar7);
              specifier_00.value._0_8_ = *(undefined8 *)((long)ldata + (uVar7 - 8));
              date_00.micros = *(int64_t *)((long)&rdata->months + uVar7);
              date_00._0_8_ = *(undefined8 *)((long)rdata + (uVar7 - 8));
              iVar9 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                                (specifier_00,date_00);
              *(long *)((long)result_data + (uVar7 - 8)) = iVar9._0_8_;
              *(int64_t *)((long)&result_data->months + uVar7) = iVar9.micros;
            }
            uVar4 = uVar4 + 1;
            uVar7 = uVar7 + 0x10;
          } while ((uVar8 - uVar6) + uVar4 != 0);
          uVar4 = uVar8 + uVar4;
        }
      }
      uVar2 = uVar2 + 1;
      uVar8 = uVar4;
    } while (uVar2 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}